

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.h
# Opt level: O0

TreeEnsembleParameters * __thiscall
CoreML::Specification::TreeEnsembleRegressor::mutable_treeensemble(TreeEnsembleRegressor *this)

{
  TreeEnsembleParameters *this_00;
  TreeEnsembleRegressor *this_local;
  
  if (this->treeensemble_ == (TreeEnsembleParameters *)0x0) {
    this_00 = (TreeEnsembleParameters *)operator_new(0x50);
    TreeEnsembleParameters::TreeEnsembleParameters(this_00);
    this->treeensemble_ = this_00;
  }
  return this->treeensemble_;
}

Assistant:

inline ::CoreML::Specification::TreeEnsembleParameters* TreeEnsembleRegressor::mutable_treeensemble() {
  
  if (treeensemble_ == NULL) {
    treeensemble_ = new ::CoreML::Specification::TreeEnsembleParameters;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.TreeEnsembleRegressor.treeEnsemble)
  return treeensemble_;
}